

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O1

void __thiscall
dap::BasicTypeInfo<dap::SetBreakpointsRequest>::destruct
          (BasicTypeInfo<dap::SetBreakpointsRequest> *this,void *ptr)

{
  void *pvVar1;
  
  Source::~Source((Source *)((long)ptr + 0x40));
  pvVar1 = *(void **)((long)ptr + 0x20);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,*(long *)((long)ptr + 0x30) - (long)pvVar1);
  }
  std::vector<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_>::~vector
            ((vector<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_> *)ptr);
  return;
}

Assistant:

inline void destruct(void* ptr) const override {
    reinterpret_cast<T*>(ptr)->~T();
  }